

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

bool __thiscall VWReaderHandler<false>::Bool(VWReaderHandler<false> *this,bool v)

{
  int iVar1;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  BaseState<false> *pBVar2;
  
  pBVar2 = (this->ctx).current_state;
  iVar1 = (*pBVar2->_vptr_BaseState[1])(pBVar2,this,CONCAT71(in_register_00000031,v) & 0xffffffff);
  pBVar2 = (BaseState<false> *)CONCAT44(extraout_var,iVar1);
  if (pBVar2 != (BaseState<false> *)0x0) {
    (this->ctx).previous_state = (this->ctx).current_state;
    (this->ctx).current_state = pBVar2;
  }
  return pBVar2 != (BaseState<false> *)0x0;
}

Assistant:

bool Bool(bool v) { return ctx.TransitionState(ctx.current_state->Bool(ctx, v)); }